

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::GetUnderlyingType
          (ValidationState_t *_,Decoration *decoration,Instruction *inst,uint32_t *underlying_type)

{
  uint32_t *this;
  Decoration *this_00;
  bool bVar1;
  int iVar2;
  Op OVar3;
  uint32_t uVar4;
  int32_t iVar5;
  DiagnosticStream *pDVar6;
  Instruction *inst_00;
  Instruction *inst_01;
  Instruction *inst_02;
  string local_620;
  DiagnosticStream local_600;
  StorageClass local_424;
  undefined1 local_420 [4];
  StorageClass storage_class;
  DiagnosticStream local_400;
  string local_228;
  DiagnosticStream local_208;
  uint32_t *local_30;
  uint32_t *underlying_type_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  ValidationState_t *__local;
  
  local_30 = underlying_type;
  underlying_type_local = (uint32_t *)inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)_;
  iVar2 = Decoration::struct_member_index(decoration);
  if (iVar2 == -1) {
    OVar3 = val::Instruction::opcode((Instruction *)underlying_type_local);
    if (OVar3 == OpTypeStruct) {
      ValidationState_t::diag
                (&local_400,(ValidationState_t *)decoration_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)underlying_type_local);
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                ((string *)local_420,(_anonymous_namespace_ *)underlying_type_local,inst_01);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_400,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_420);
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(char (*) [75])
                                 " did not find an member index to get underlying data type for struct type."
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      std::__cxx11::string::~string((string *)local_420);
      DiagnosticStream::~DiagnosticStream(&local_400);
    }
    else {
      OVar3 = val::Instruction::opcode((Instruction *)underlying_type_local);
      iVar5 = spvOpcodeIsConstant(OVar3);
      this_00 = decoration_local;
      if (iVar5 == 0) {
        uVar4 = val::Instruction::type_id((Instruction *)underlying_type_local);
        bVar1 = ValidationState_t::GetPointerTypeInfo
                          ((ValidationState_t *)this_00,uVar4,local_30,&local_424);
        if (bVar1) {
          __local._4_4_ = SPV_SUCCESS;
        }
        else {
          ValidationState_t::diag
                    (&local_600,(ValidationState_t *)decoration_local,SPV_ERROR_INVALID_DATA,
                     (Instruction *)underlying_type_local);
          (anonymous_namespace)::GetIdDesc_abi_cxx11_
                    (&local_620,(_anonymous_namespace_ *)underlying_type_local,inst_02);
          pDVar6 = DiagnosticStream::operator<<(&local_600,&local_620);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [112])
                                     " is decorated with BuiltIn. BuiltIn decoration should only be applied to struct types, variables and constants."
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_620);
          DiagnosticStream::~DiagnosticStream(&local_600);
        }
      }
      else {
        uVar4 = val::Instruction::type_id((Instruction *)underlying_type_local);
        *local_30 = uVar4;
        __local._4_4_ = SPV_SUCCESS;
      }
    }
  }
  else {
    OVar3 = val::Instruction::opcode((Instruction *)underlying_type_local);
    this = underlying_type_local;
    if (OVar3 == OpTypeStruct) {
      iVar2 = Decoration::struct_member_index((Decoration *)inst_local);
      uVar4 = val::Instruction::word((Instruction *)this,(long)(iVar2 + 2));
      *local_30 = uVar4;
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                (&local_208,(ValidationState_t *)decoration_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)underlying_type_local);
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                (&local_228,(_anonymous_namespace_ *)underlying_type_local,inst_00);
      pDVar6 = DiagnosticStream::operator<<(&local_208,&local_228);
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(char (*) [76])
                                 "Attempted to get underlying data type via member index for non-struct type."
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      std::__cxx11::string::~string((string *)&local_228);
      DiagnosticStream::~DiagnosticStream(&local_208);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t GetUnderlyingType(ValidationState_t& _,
                               const Decoration& decoration,
                               const Instruction& inst,
                               uint32_t* underlying_type) {
  if (decoration.struct_member_index() != Decoration::kInvalidMember) {
    if (inst.opcode() != spv::Op::OpTypeStruct) {
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << GetIdDesc(inst)
             << "Attempted to get underlying data type via member index for "
                "non-struct type.";
    }
    *underlying_type = inst.word(decoration.struct_member_index() + 2);
    return SPV_SUCCESS;
  }

  if (inst.opcode() == spv::Op::OpTypeStruct) {
    return _.diag(SPV_ERROR_INVALID_DATA, &inst)
           << GetIdDesc(inst)
           << " did not find an member index to get underlying data type for "
              "struct type.";
  }

  if (spvOpcodeIsConstant(inst.opcode())) {
    *underlying_type = inst.type_id();
    return SPV_SUCCESS;
  }

  spv::StorageClass storage_class;
  if (!_.GetPointerTypeInfo(inst.type_id(), underlying_type, &storage_class)) {
    return _.diag(SPV_ERROR_INVALID_DATA, &inst)
           << GetIdDesc(inst)
           << " is decorated with BuiltIn. BuiltIn decoration should only be "
              "applied to struct types, variables and constants.";
  }
  return SPV_SUCCESS;
}